

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfd-test.c
# Opt level: O0

uint64_t wait_for_timerfd(int timerfd)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  ssize_t r;
  uint64_t timeouts;
  undefined2 local_10;
  undefined2 local_e;
  pollfd pfd;
  int timerfd_local;
  
  local_10 = 1;
  local_e = 0;
  timeouts._4_4_ = timerfd;
  pfd.fd = timerfd;
  iVar1 = poll((pollfd *)((long)&timeouts + 4),1,-1);
  if (iVar1 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/timerfd-test.c"
               ,0x55,"poll(&pfd, 1, -1) == 1");
  }
  uVar2 = read(pfd.fd,&r,8);
  if (uVar2 != 8) {
    piVar3 = __errno_location();
    microatf_fail_require
              ("%s:%d: %d %d",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/timerfd-test.c"
               ,0x5a,uVar2 & 0xffffffff,*piVar3);
  }
  if (r == 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/timerfd-test.c"
               ,0x5b,"timeouts > 0");
  }
  return r;
}

Assistant:

static uint64_t
wait_for_timerfd(int timerfd)
{
	struct pollfd pfd = { .fd = timerfd, .events = POLLIN };

	ATF_REQUIRE(poll(&pfd, 1, -1) == 1);

	uint64_t timeouts;
	ssize_t r = read(timerfd, &timeouts, sizeof(timeouts));

	ATF_REQUIRE_MSG(r == (ssize_t)sizeof(timeouts), "%d %d", (int)r, errno);
	ATF_REQUIRE(timeouts > 0);
	return timeouts;
}